

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRepBtree *
absl::lts_20250127::cord_internal::CordRepBtree::
Merge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *dst,CordRepBtree *src)

{
  size_t length_00;
  undefined8 this;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  CordRepBtree *this_00;
  iterator ppCVar6;
  OpResult OVar7;
  OpResult result_00;
  OpResult result_01;
  undefined4 local_118;
  undefined4 uStack_104;
  CordRep *edge;
  iterator __end5;
  iterator __begin5;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_d8;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range5;
  CordRepBtree *local_c0;
  Action local_b8;
  undefined4 uStack_b4;
  CordRepBtree *local_b0;
  OpResult result;
  CordRepBtree *merge_node;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> ops;
  int depth;
  size_t length;
  CordRepBtree *src_local;
  CordRepBtree *dst_local;
  
  iVar2 = height(dst);
  iVar3 = height(src);
  if (iVar2 < iVar3) {
    __assert_fail("dst->height() >= src->height()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x295,
                  "static CordRepBtree *absl::cord_internal::CordRepBtree::Merge(CordRepBtree *, CordRepBtree *) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                 );
  }
  length_00 = (src->super_CordRep).length;
  iVar2 = height(dst);
  iVar3 = height(src);
  ops.stack[0xb]._4_4_ = iVar2 - iVar3;
  result._8_8_ = anon_unknown_0::
                 StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                 BuildStack((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)&merge_node,dst,ops.stack[0xb]._4_4_);
  sVar4 = size((CordRepBtree *)result._8_8_);
  sVar5 = size(src);
  this = result._8_8_;
  if (sVar4 + sVar5 < 7) {
    bVar1 = anon_unknown_0::
            StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::owned
                      ((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                        *)&merge_node,ops.stack[0xb]._4_4_);
    OVar7 = ToOpResult((CordRepBtree *)this,bVar1);
    this_00 = OVar7.tree;
    local_b8 = OVar7.action;
    result.tree = (CordRepBtree *)CONCAT44(uStack_b4,local_b8);
    local_c0 = this_00;
    local_b0 = this_00;
    ___range5 = Edges(src);
    Add<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>(this_00,___range5);
    sVar5 = (src->super_CordRep).length + (local_b0->super_CordRep).length;
    (local_b0->super_CordRep).length = sVar5;
    bVar1 = RefcountAndFlags::IsOne(&(src->super_CordRep).refcount);
    if (bVar1) {
      Delete(src);
    }
    else {
      ___begin5 = Edges(src);
      local_d8 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin5;
      __end5 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_d8);
      ppCVar6 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_d8);
      for (; __end5 != ppCVar6; __end5 = __end5 + 1) {
        CordRep::Ref(*__end5);
      }
      CordRep::Unref(&src->super_CordRep);
    }
  }
  else {
    result.tree = (CordRepBtree *)CONCAT44(uStack_104,2);
    local_b0 = src;
  }
  local_118 = SUB84(result.tree,0);
  if (ops.stack[0xb]._4_4_ == 0) {
    result_00.tree = (CordRepBtree *)((ulong)result.tree & 0xffffffff);
    result_00._8_8_ = sVar5;
    dst_local = anon_unknown_0::
                StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                          *)dst,local_b0,result_00);
  }
  else {
    result_01.action = local_118;
    result_01.tree = local_b0;
    result_01._12_4_ = 0;
    dst_local = anon_unknown_0::
                StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                Unwind<false>((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               *)&merge_node,dst,ops.stack[0xb]._4_4_,length_00,result_01);
  }
  return dst_local;
}

Assistant:

CordRepBtree* CordRepBtree::Merge(CordRepBtree* dst, CordRepBtree* src) {
  assert(dst->height() >= src->height());

  // Capture source length as we may consume / destroy `src`.
  const size_t length = src->length;

  // We attempt to merge `src` at its corresponding height in `dst`.
  const int depth = dst->height() - src->height();
  StackOperations<edge_type> ops;
  CordRepBtree* merge_node = ops.BuildStack(dst, depth);

  // If there is enough space in `merge_node` for all edges from `src`, add all
  // edges to this node, making a fresh copy as needed if not privately owned.
  // If `merge_node` does not have capacity for `src`, we rely on `Unwind` and
  // `Finalize` to merge `src` into the first level towards `root` where there
  // is capacity for another edge, or create a new top level node.
  OpResult result;
  if (merge_node->size() + src->size() <= kMaxCapacity) {
    result = merge_node->ToOpResult(ops.owned(depth));
    result.tree->Add<edge_type>(src->Edges());
    result.tree->length += src->length;
    if (src->refcount.IsOne()) {
      Delete(src);
    } else {
      for (CordRep* edge : src->Edges()) CordRep::Ref(edge);
      CordRepBtree::Unref(src);
    }
  } else {
    result = {src, kPopped};
  }

  // Unless we merged at the top level (i.e.: src and dst are equal height),
  // unwind the result towards the top level, and finalize the result.
  if (depth) {
    return ops.Unwind(dst, depth, length, result);
  }
  return ops.Finalize(dst, result);
}